

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Term.cpp
# Opt level: O0

string * __thiscall Kernel::Term::toString_abi_cxx11_(Term *this,bool topLevel)

{
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_TermIterators_hpp:866:12),_Kernel::TermList>_>
  i;
  Interleaved<char,_Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_TermIterators_hpp:866:12),_Kernel::TermList>_>_>
  self;
  byte bVar1;
  bool bVar2;
  Combinator CVar3;
  TermList *pTVar4;
  Symbol *this_00;
  ostream *poVar5;
  byte in_DL;
  Term *in_RSI;
  char *pcVar6;
  Term *in_RDI;
  stringstream out;
  TermList arg2;
  TermList arg1;
  bool printArgs;
  string *res;
  Term *in_stack_00000548;
  uint in_stack_fffffffffffffcec;
  Signature *in_stack_fffffffffffffcf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcf8;
  ostream *in_stack_fffffffffffffd10;
  undefined7 in_stack_fffffffffffffd20;
  undefined7 uVar7;
  undefined1 in_stack_fffffffffffffd27;
  undefined1 uVar8;
  undefined7 in_stack_fffffffffffffd28;
  byte in_stack_fffffffffffffd2f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd30;
  undefined8 in_stack_fffffffffffffd38;
  Term *this_01;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 local_290;
  char local_281;
  Interleaved<char,_Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_TermIterators_hpp:866:12),_Kernel::TermList>_>_>
  local_280;
  string local_260 [32];
  stringstream local_240 [16];
  undefined1 local_230 [376];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  uint64_t local_38;
  uint64_t local_30;
  undefined1 local_25;
  allocator<char> local_13;
  byte local_12;
  byte local_11;
  
  local_11 = in_DL & 1;
  local_12 = 1;
  this_01 = in_RDI;
  bVar2 = isSuper((Term *)in_stack_fffffffffffffcf0);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd30,
               (char *)CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28),
               (allocator<char> *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20));
    std::allocator<char>::~allocator(&local_13);
  }
  else {
    bVar2 = isSpecial((Term *)0x9857fb);
    bVar1 = local_12;
    if ((!bVar2) && (bVar2 = isLiteral((Term *)0x98580d), bVar1 = local_12, !bVar2)) {
      bVar2 = isSort((Term *)0x98581f);
      if ((bVar2) && (bVar2 = AtomicSort::isArrowSort((AtomicSort *)0x985832), bVar2)) {
        local_25 = 0;
        std::__cxx11::string::string((string *)in_RDI);
        pTVar4 = nthArgument(in_RSI,0);
        local_30 = pTVar4->_content;
        pTVar4 = nthArgument(in_RSI,1);
        local_38 = pTVar4->_content;
        pcVar6 = "(";
        if ((local_11 & 1) != 0) {
          pcVar6 = "";
        }
        std::__cxx11::string::operator+=((string *)in_RDI,pcVar6);
        TermList::toString_abi_cxx11_
                  ((TermList *)CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28),
                   (bool)in_stack_fffffffffffffd27);
        std::operator+(in_stack_fffffffffffffcf8,(char *)in_stack_fffffffffffffcf0);
        TermList::toString_abi_cxx11_
                  ((TermList *)CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28),
                   (bool)in_stack_fffffffffffffd27);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20));
        std::__cxx11::string::operator+=((string *)in_RDI,local_58);
        std::__cxx11::string::~string(local_58);
        std::__cxx11::string::~string(local_b8);
        std::__cxx11::string::~string(local_78);
        std::__cxx11::string::~string(local_98);
        pcVar6 = ")";
        if ((local_11 & 1) != 0) {
          pcVar6 = "";
        }
        std::__cxx11::string::operator+=((string *)in_RDI,pcVar6);
        return (string *)this_01;
      }
      bVar2 = isSort((Term *)0x985a85);
      in_stack_fffffffffffffd2f = 1;
      bVar1 = in_stack_fffffffffffffd2f;
      if (!bVar2) {
        this_00 = Signature::getFunction(in_stack_fffffffffffffcf0,in_stack_fffffffffffffcec);
        CVar3 = Signature::Symbol::combinator(this_00);
        in_stack_fffffffffffffd2f = CVar3 == NOT_COMB;
        bVar1 = (bool)in_stack_fffffffffffffd2f;
      }
    }
    local_12 = bVar1;
    std::__cxx11::stringstream::stringstream(local_240);
    uVar7 = SUB87(local_230,0);
    uVar8 = (undefined1)((ulong)local_230 >> 0x38);
    headToString_abi_cxx11_(in_stack_00000548);
    std::operator<<((ostream *)CONCAT17(uVar8,uVar7),local_260);
    std::__cxx11::string::~string(local_260);
    if (((*(uint *)&in_RSI->field_0xc & 0xfffffff) != 0) && ((local_12 & 1) != 0)) {
      local_281 = ',';
      Kernel::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)this_01,in_RDI);
      i._iter._inner._0_8_ = uStack_298;
      i._iter._func.term = (Term *)local_2a0;
      i._iter._16_8_ = local_290;
      Lib::Output::operator()(&local_280,&local_281,i);
      self.sep._7_1_ = uVar8;
      self.sep._0_7_ = uVar7;
      self.iter._iter._func.term._0_7_ = in_stack_fffffffffffffd28;
      self.iter._iter._func.term._7_1_ = in_stack_fffffffffffffd2f;
      self.iter._iter._inner._0_8_ = in_stack_fffffffffffffd30;
      self.iter._iter._16_8_ = in_stack_fffffffffffffd38;
      poVar5 = Lib::Output::operator<<<char,Lib::IterTraits<Lib::MappingIterator<Lib::
               RangeIterator<unsigned_int>,Kernel::$_4::TEMPNAMEPLACEHOLDERVALUE(Kernel::
               Term_const*)const::{lambda(auto:1)#1},Kernel::operator()
                         (in_stack_fffffffffffffd10,self);
      std::operator<<(poVar5,")");
    }
    std::__cxx11::stringstream::str();
    std::__cxx11::stringstream::~stringstream(local_240);
  }
  return (string *)this_01;
}

Assistant:

std::string Term::toString(bool topLevel) const
{
  bool printArgs = true;

  if(isSuper()){
    return "$tType";
  }

  if(!isSpecial() && !isLiteral()){
    if(isSort() && static_cast<AtomicSort*>(const_cast<Term*>(this))->isArrowSort()){
      ASS(arity() == 2);
      std::string res;
      TermList arg1 = *(nthArgument(0));
      TermList arg2 = *(nthArgument(1));
      res += topLevel ? "" : "(";
      res += arg1.toString(false) + " > " + arg2.toString();
      res += topLevel ? "" : ")";
      return res;
    }

    printArgs = isSort() || env.signature->getFunction(_functor)->combinator() == Signature::NOT_COMB;
  }

#if NICE_THEORY_OUTPUT
  auto theoryTerm = Kernel::tryNumTraits([&](auto numTraits) {
    using NumTraits = decltype(numTraits);
    auto maybeParMul = [&](auto t) { 
        auto needsPar = t.isTerm() && NumTraits::isAdd(t.term()->functor());
        return t.toString(!needsPar);
      };
    auto uminus = [&]()  {
      std::stringstream out;
      out << "-" << maybeParMul(termArg(0));
      return Option<std::string>(out.str());
    };
    auto binary = [&](auto sym)  {
      auto needsPar = !topLevel;
      auto maybePar = [&](auto t) { 
        return t.toString(
            t.isTerm() && (
              t.term()->functor() == _functor 
              || (NumTraits::isAdd(_functor) && NumTraits::isMul(t.term()->functor()))
              )
            );
      };
      std::stringstream out;
      out << (needsPar ? "(" : "");
      out << maybePar(termArg(0)) << sym << maybePar(termArg(1));
      out << (needsPar ? ")" : "");
      return Option<std::string>(out.str());
    };
    if (isLiteral()) {
      if (NumTraits::isGreater(_functor)) {
        return binary(">");
      } else if (NumTraits::isGeq(_functor)) {
        return binary(">=");
      }
      /* nothing */
    } else if (isSort()) {
      /* nothing */
    } else {
      if (NumTraits::isAdd(_functor)) {
        return binary(" + ");
      } else if (NumTraits::isMul(_functor)) {
        return binary(" ");
      } else if (auto c = NumTraits::tryLinMul(_functor)) {
        return *c == -1 ? some(Output::toString("-", maybeParMul(termArg(0))))
                        : some(Output::toString(*c, " ", maybeParMul(termArg(0))));
      } else if (NumTraits::isFloor(_functor)) {
        return some(Output::toString("⌊", termArg(0), "⌋"));
      } else if (NumTraits::isMinus(_functor)) {
        return uminus();
      }
    }
    /* this means we have an uninterpteted term which will be formatted as usual */
    return Option<std::string>();
  });

  if (theoryTerm.isSome()) {
    return theoryTerm.unwrap();
  }
#endif // NICE_THEORY_OUTPUT

  std::stringstream out;
  out << headToString();
  
  if (_arity && printArgs) {
    out << Output::interleaved(',', anyArgIter(this)) << ")";
  }
  return out.str();
}